

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Var::assign_(Var *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  int iVar1;
  VarException *pVVar2;
  UserException *this_00;
  undefined4 in_register_00000014;
  shared_ptr<kratos::Var> *__args_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::AssignStmt> sVar4;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  IRNode *local_f8;
  element_type *local_f0;
  IRNode *local_e8;
  element_type *peStack_e0;
  undefined1 auStack_c8 [8];
  AllConcat all_concat;
  string local_58;
  AssignmentType local_30;
  allocator_type local_29;
  AssignmentType type_local;
  
  __args_1 = (shared_ptr<kratos::Var> *)CONCAT44(in_register_00000014,type);
  if ((__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(&local_58,var);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8,
                   "Trying to assign null to ",&local_58);
    UserException::UserException(this_00,(string *)auStack_c8);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = *(int *)&var[0x16].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
  if (iVar1 == 1) {
    all_concat.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    all_concat.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    all_concat.super_IRVisitor._8_8_ =
         &all_concat.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    all_concat.super_IRVisitor._vptr_IRVisitor = (_func_int **)0x0;
    all_concat.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    all_concat.super_IRVisitor.visited_._M_h._M_element_count = 0x3f800000;
    all_concat.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    all_concat.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    all_concat.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    auStack_c8 = (undefined1  [8])&PTR_visit_root_002ac438;
    all_concat.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)0x1;
    IRVisitor::visit_root((IRVisitor *)auStack_c8,(IRNode *)var);
    if ((char)all_concat.super_IRVisitor.visited_._M_h._M_single_bucket == '\0') {
      pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
      (*(((__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_IRNode)._vptr_IRNode[0x1f])(&local_e8);
      local_58.field_2._M_allocated_capacity =
           (size_type)
           var[7].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_58.field_2._8_8_ =
           var[8].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)local_e8;
      local_58._M_string_length = (size_type)peStack_e0;
      format_str_00.size_ = 0xdd;
      format_str_00.data_ = (char *)0x22;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)&all_concat.legal,(detail *)"Cannot assign {0} to an expression",
                 format_str_00,args_00);
      local_f0 = (__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __l_00._M_len = 2;
      __l_00._M_array = &local_f8;
      local_f8 = (IRNode *)var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_58,__l_00,&local_29);
      VarException::VarException
                (pVVar2,(string *)&all_concat.legal,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_58);
      __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    auStack_c8 = (undefined1  [8])&PTR_visit_root_002adb38;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&all_concat.super_IRVisitor.level);
  }
  else if (iVar1 == 3) {
    pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
    (*(((__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_IRNode)._vptr_IRNode[0x1f])(&all_concat.legal);
    all_concat.super_IRVisitor._8_8_ =
         var[7].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    all_concat.super_IRVisitor.visited_._M_h._M_buckets =
         (__buckets_ptr)var[8].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auStack_c8 = (undefined1  [8])all_concat._72_8_;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x20;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_c8;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_58,(detail *)"Cannot assign {0} to a const {1}",format_str,args);
    peStack_e0 = (__args_1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l._M_len = 2;
    __l._M_array = &local_e8;
    local_e8 = (IRNode *)var;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_c8
               ,__l,(allocator_type *)&local_f8);
    VarException::VarException
              (pVVar2,&local_58,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_c8
              );
    __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_c8,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &var[6].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::AssignStmt,std::allocator<kratos::AssignStmt>,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>const&,kratos::AssignmentType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_IRNode).fn_name_ln,
             (AssignStmt **)this,(allocator<kratos::AssignStmt> *)&local_58,
             (shared_ptr<kratos::Var> *)auStack_c8,__args_1,&local_30);
  std::__shared_ptr<kratos::AssignStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::AssignStmt,kratos::AssignStmt>
            ((__shared_ptr<kratos::AssignStmt,(__gnu_cxx::_Lock_policy)2> *)this,
             (AssignStmt *)(this->super_IRNode)._vptr_IRNode);
  _Var3._M_pi = extraout_RDX;
  if (all_concat.super_IRVisitor._vptr_IRVisitor != (_func_int **)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               all_concat.super_IRVisitor._vptr_IRVisitor);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Var::assign_(const std::shared_ptr<Var> &var, AssignmentType type) {
    if (!var) {
        throw UserException("Trying to assign null to " + to_string());
    }
    // if it's a constant or expression, it can't be assigned to
    if (type_ == VarType::ConstValue) {
        throw VarException(::format("Cannot assign {0} to a const {1}", var->to_string(), name),
                           {this, var.get()});
    } else if (type_ == VarType::Expression) {
        auto all_concat = AllConcat();
        all_concat.visit_root(this);
        if (!all_concat.legal)
            throw VarException(
                ::format("Cannot assign {0} to an expression", var->to_string(), name),
                {this, var.get()});
    }

    auto stmt = ::make_shared<AssignStmt>(shared_from_this(), var, type);

    return stmt;
}